

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

void __thiscall llvm::detail::IEEEFloat::IEEEFloat(IEEEFloat *this,fltSemantics *ourSemantics)

{
  initialize(this,ourSemantics);
  this->field_0x12 = this->field_0x12 & 0xf0 | 3;
  return;
}

Assistant:

IEEEFloat::IEEEFloat(const fltSemantics &ourSemantics) {
  initialize(&ourSemantics);
  category = fcZero;
  sign = false;
}